

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Buf.h
# Opt level: O2

void __thiscall
axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::attachBufHdr
          (BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *this,BufHdr *hdr)

{
  int32_t *piVar1;
  BufHdr *this_00;
  
  this_00 = this->m_hdr;
  if (this_00 != hdr) {
    if (hdr != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      this_00 = this->m_hdr;
    }
    if (this_00 != (BufHdr *)0x0) {
      RefCount::release(&this_00->super_RefCount);
    }
    this->m_hdr = hdr;
  }
  return;
}

Assistant:

void
	attachBufHdr(BufHdr* hdr) {
		if (hdr == m_hdr)
			return; // try to avoid unnecessary interlocked ops

		if (hdr)
			hdr->addRef();

		if (m_hdr)
			m_hdr->release();

		m_hdr = hdr;
	}